

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_a<ncnn::BinaryOp_x86_functor::binary_op_sub>
               (float *ptr,float *ptr1,float *outptr,int size,int elempack)

{
  float fVar1;
  undefined8 local_118;
  undefined8 uStack_110;
  int local_d4;
  float *local_c0;
  float *local_b8;
  __m128 _outp;
  __m128 _b;
  __m128 _a_128;
  int i;
  float a;
  binary_op_sub op;
  int elempack_local;
  int size_local;
  float *outptr_local;
  float *ptr1_local;
  float *ptr_local;
  float fStack_10;
  float fStack_c;
  
  fVar1 = *ptr;
  local_d4 = 0;
  local_c0 = outptr;
  local_b8 = ptr1;
  if (elempack == 4) {
    local_118 = *(undefined8 *)ptr;
    uStack_110 = *(undefined8 *)(ptr + 2);
  }
  else {
    local_118 = CONCAT44(fVar1,fVar1);
    uStack_110 = CONCAT44(fVar1,fVar1);
  }
  for (; local_d4 + 3 < size; local_d4 = local_d4 + 4) {
    ptr_local._0_4_ = (float)local_118;
    ptr_local._4_4_ = (float)((ulong)local_118 >> 0x20);
    fStack_10 = (float)uStack_110;
    fStack_c = (float)((ulong)uStack_110 >> 0x20);
    outptr_local._0_4_ = (float)*(undefined8 *)local_b8;
    outptr_local._4_4_ = (float)((ulong)*(undefined8 *)local_b8 >> 0x20);
    ptr1_local._0_4_ = (float)*(undefined8 *)(local_b8 + 2);
    ptr1_local._4_4_ = (float)((ulong)*(undefined8 *)(local_b8 + 2) >> 0x20);
    *(ulong *)local_c0 =
         CONCAT44(ptr_local._4_4_ - outptr_local._4_4_,ptr_local._0_4_ - outptr_local._0_4_);
    *(ulong *)(local_c0 + 2) = CONCAT44(fStack_c - ptr1_local._4_4_,fStack_10 - ptr1_local._0_4_);
    local_b8 = local_b8 + 4;
    local_c0 = local_c0 + 4;
  }
  for (; local_d4 < size; local_d4 = local_d4 + 1) {
    *local_c0 = fVar1 - *local_b8;
    local_b8 = local_b8 + 1;
    local_c0 = local_c0 + 1;
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_a(const float* ptr, const float* ptr1, float* outptr, int size, int elempack)
{
    const Op op;

    const float a = *ptr;

    int i = 0;
#if __SSE2__
    __m128 _a_128 = (elempack == 4) ? _mm_loadu_ps(ptr) : _mm_set1_ps(a);
#if __AVX__
    __m256 _a_256 = (elempack == 8) ? _mm256_loadu_ps(ptr) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a_128), _a_128, 1);
#if __AVX512F__
    __m512 _a_512 = (elempack == 16) ? _mm512_loadu_ps(ptr) : _mm512_insertf32x8(_mm512_castps256_ps512(_a_256), _a_256, 1);
    for (; i + 15 < size; i += 16)
    {
        __m512 _b = _mm512_loadu_ps(ptr1);
        __m512 _outp = op.func_pack16(_a_512, _b);
        _mm512_storeu_ps(outptr, _outp);
        ptr1 += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    for (; i + 7 < size; i += 8)
    {
        __m256 _b = _mm256_loadu_ps(ptr1);
        __m256 _outp = op.func_pack8(_a_256, _b);
        _mm256_storeu_ps(outptr, _outp);
        ptr1 += 8;
        outptr += 8;
    }
#endif // __AVX__
    for (; i + 3 < size; i += 4)
    {
        __m128 _b = _mm_loadu_ps(ptr1);
        __m128 _outp = op.func_pack4(_a_128, _b);
        _mm_storeu_ps(outptr, _outp);
        ptr1 += 4;
        outptr += 4;
    }
#endif // __SSE2__
    for (; i < size; i++)
    {
        *outptr = op.func(a, *ptr1);
        ptr1 += 1;
        outptr += 1;
    }
}